

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

bool __thiscall soul::Value::PackedData::StructIterator::next(StructIterator *this)

{
  size_t i;
  Type *this_00;
  uint64_t uVar1;
  bool bVar2;
  StructIterator *this_local;
  
  bVar2 = this->index < this->numMembers;
  if (bVar2) {
    this->member = this->member + this->memberSize;
    i = this->index;
    this->index = i + 1;
    this_00 = Structure::getMemberType(this->structure,i);
    uVar1 = Type::getPackedSizeInBytes(this_00);
    this->memberSize = uVar1;
  }
  return bVar2;
}

Assistant:

bool next()
        {
            if (index >= numMembers)
                return false;

            member += memberSize;
            memberSize = (size_t) structure.getMemberType (index++).getPackedSizeInBytes();
            return true;
        }